

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SentenceFinderAdd(Fts5SFinder *p,int iAdd)

{
  int iVar1;
  int *piVar2;
  int local_2c;
  int *aNew;
  int nNew;
  int iAdd_local;
  Fts5SFinder *p_local;
  
  if (p->nFirstAlloc == p->nFirst) {
    if (p->nFirstAlloc == 0) {
      local_2c = 0x40;
    }
    else {
      local_2c = p->nFirstAlloc << 1;
    }
    piVar2 = (int *)sqlite3_realloc64(p->aFirst,(long)local_2c << 2);
    if (piVar2 == (int *)0x0) {
      return 7;
    }
    p->aFirst = piVar2;
    p->nFirstAlloc = local_2c;
  }
  iVar1 = p->nFirst;
  p->nFirst = iVar1 + 1;
  p->aFirst[iVar1] = iAdd;
  return 0;
}

Assistant:

static int fts5SentenceFinderAdd(Fts5SFinder *p, int iAdd){
  if( p->nFirstAlloc==p->nFirst ){
    int nNew = p->nFirstAlloc ? p->nFirstAlloc*2 : 64;
    int *aNew;

    aNew = (int*)sqlite3_realloc64(p->aFirst, nNew*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    p->aFirst = aNew;
    p->nFirstAlloc = nNew;
  }
  p->aFirst[p->nFirst++] = iAdd;
  return SQLITE_OK;
}